

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O3

void CheckColorContrast(TidyDocImpl *doc,Node *node)

{
  TidyAttrId TVar1;
  int iVar2;
  uint uVar3;
  Bool BVar4;
  Bool BVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint code;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  AttVal *pAVar13;
  ctmbstr cp;
  char *pcVar14;
  int brightBG;
  int rgbFG [3];
  int rgbBG [3];
  int local_58 [4];
  int local_48 [4];
  int local_38;
  int local_34;
  
  local_48[0] = 0xff;
  local_48[1] = 0xff;
  local_48[2] = 0xff;
  if (((doc->access).PRIORITYCHK == 3) && (pAVar13 = node->attributes, pAVar13 != (AttVal *)0x0)) {
    BVar5 = yes;
    do {
      if (((pAVar13->dict != (Attribute *)0x0) && (pAVar13->dict->id == TidyAttr_BGCOLOR)) &&
         (pcVar14 = pAVar13->value, pcVar14 != (char *)0x0)) {
        do {
          if (*pcVar14 == '\0') goto LAB_00153525;
          BVar4 = prvTidyIsWhite((int)*pcVar14);
          pcVar14 = pcVar14 + 1;
        } while (BVar4 != no);
        BVar5 = GetRgb(pAVar13->value,local_48);
      }
LAB_00153525:
      pAVar13 = pAVar13->next;
    } while (pAVar13 != (AttVal *)0x0);
    pAVar13 = node->attributes;
    if (pAVar13 != (AttVal *)0x0 && BVar5 != no) {
      local_34 = local_48[0];
      iVar6 = local_48[0] * 299;
      local_38 = local_48[1];
      iVar8 = local_48[1] * 0x24b;
      local_48[3] = local_48[2];
      iVar7 = local_48[2] * 0x72;
      do {
        if (pAVar13->dict != (Attribute *)0x0) {
          TVar1 = pAVar13->dict->id;
          if ((int)TVar1 < 0x95) {
            if (TVar1 == TidyAttr_ALINK) {
              code = 0x2b3;
            }
            else {
              if (TVar1 != TidyAttr_LINK) goto LAB_001536ae;
              code = 0x2b2;
            }
          }
          else if (TVar1 == TidyAttr_TEXT) {
            code = 0x2b1;
          }
          else {
            if (TVar1 != TidyAttr_VLINK) goto LAB_001536ae;
            code = 0x2b4;
          }
          pcVar14 = pAVar13->value;
          if (pcVar14 != (char *)0x0) {
            do {
              if (*pcVar14 == '\0') goto LAB_001536ae;
              BVar5 = prvTidyIsWhite((int)*pcVar14);
              pcVar14 = pcVar14 + 1;
            } while (BVar5 != no);
            local_58[2] = 0;
            local_58[0] = 0;
            local_58[1] = 0;
            BVar5 = GetRgb(pAVar13->value,local_58);
            if (BVar5 != no) {
              iVar2 = (int)((ulong)((long)(local_58[2] * 0x72 +
                                          local_58[1] * 0x24b + local_58[0] * 299) * -0x10624dd3) >>
                           0x20);
              uVar9 = ((iVar2 >> 6) - (iVar2 >> 0x1f)) + (iVar7 + iVar8 + iVar6) / 1000;
              uVar3 = -uVar9;
              if (0 < (int)uVar9) {
                uVar3 = uVar9;
              }
              iVar10 = local_34 - local_58[0];
              iVar2 = -iVar10;
              if (0 < iVar10) {
                iVar2 = iVar10;
              }
              iVar11 = local_38 - local_58[1];
              iVar10 = -iVar11;
              if (0 < iVar11) {
                iVar10 = iVar11;
              }
              iVar12 = local_48[3] - local_58[2];
              iVar11 = -iVar12;
              if (0 < iVar12) {
                iVar11 = iVar12;
              }
              if ((uVar3 < 0xb5) || ((uint)(iVar10 + iVar2 + iVar11) < 0x1f5)) {
                prvTidyReportAccessError(doc,node,code);
              }
            }
          }
        }
LAB_001536ae:
        pAVar13 = pAVar13->next;
      } while (pAVar13 != (AttVal *)0x0);
    }
  }
  return;
}

Assistant:

static void CheckColorContrast( TidyDocImpl* doc, Node* node )
{
    int rgbBG[3] = {255,255,255};   /* Black text on white BG */

    if (Level3_Enabled( doc ))
    {
        Bool gotBG = yes;
        AttVal* av;

        /* Check for 'BGCOLOR' first to compare with other color attributes */
        for ( av = node->attributes; av; av = av->next )
        {            
            if ( attrIsBGCOLOR(av) )
            {
                if ( hasValue(av) )
                    gotBG = GetRgb( av->value, rgbBG );
            }
        }
        
        /* 
           Search for COLOR attributes to compare with background color
           Must have valid colour contrast
        */
        for ( av = node->attributes; gotBG && av != NULL; av = av->next )
        {
            uint errcode = 0;
            if ( attrIsTEXT(av) )
                errcode = COLOR_CONTRAST_TEXT;
            else if ( attrIsLINK(av) )
                errcode = COLOR_CONTRAST_LINK;
            else if ( attrIsALINK(av) )
                errcode = COLOR_CONTRAST_ACTIVE_LINK;
            else if ( attrIsVLINK(av) )
                errcode = COLOR_CONTRAST_VISITED_LINK;

            if ( errcode && hasValue(av) )
            {
                int rgbFG[3] = {0, 0, 0};  /* Black text */

                if ( GetRgb(av->value, rgbFG) &&
                     !CompareColors(rgbBG, rgbFG) )
                {
                    TY_(ReportAccessError)( doc, node, errcode );
                }
            }
        }
    }
}